

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O3

int decompress_smooth_data(j_decompress_ptr cinfo,JSAMPIMAGE output_buf)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  jpeg_d_coef_controller *pjVar6;
  JBLOCKROW output_row;
  _func_JBLOCKARRAY_j_common_ptr_jvirt_barray_ptr_JDIMENSION_JDIMENSION_boolean *p_Var7;
  _func_int_j_decompress_ptr_JSAMPIMAGE *p_Var8;
  JQUANT_TBL *pJVar9;
  inverse_DCT_method_ptr p_Var10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  uint uVar29;
  long lVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  JCOEF JVar42;
  uint uVar43;
  int iVar44;
  uint uVar45;
  uint uVar46;
  int iVar47;
  int iVar48;
  JBLOCKARRAY ppaJVar49;
  long lVar50;
  jpeg_decomp_master *pjVar51;
  int iVar52;
  ulong uVar53;
  int iVar54;
  uint uVar55;
  int iVar56;
  JBLOCKROW paJVar58;
  long lVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  ulong uVar65;
  int iVar66;
  int iVar67;
  ulong uVar68;
  int iVar69;
  long lVar70;
  int iVar71;
  int iVar72;
  jpeg_component_info *pjVar73;
  JDIMENSION JVar74;
  JBLOCKROW paJVar75;
  int iVar76;
  bool bVar77;
  int local_238;
  JBLOCKROW local_1c0;
  JBLOCKROW local_1b8;
  JBLOCKROW local_180;
  JSAMPARRAY local_170;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  ulong uVar57;
  
  pjVar6 = cinfo->coef;
  JVar74 = cinfo->total_iMCU_rows;
  uVar43 = JVar74 - 1;
  output_row = (JBLOCKROW)pjVar6[3].start_output_pass;
  while( true ) {
    if (((cinfo->output_scan_number < cinfo->input_scan_number) ||
        (cinfo->inputctl->eoi_reached != 0)) ||
       ((cinfo->input_scan_number == cinfo->output_scan_number &&
        ((uint)(cinfo->Ss == 0) * 2 + cinfo->output_iMCU_row < cinfo->input_iMCU_row)))) break;
    iVar44 = (*cinfo->inputctl->consume_input)(cinfo);
    if (iVar44 == 0) {
      return 0;
    }
  }
  if (0 < cinfo->num_components) {
    pjVar73 = cinfo->comp_info;
    uVar45 = JVar74 - 2;
    lVar70 = 0;
    local_150 = 0;
    local_148 = 0;
    local_140 = 0;
    local_138 = 0;
    do {
      if (pjVar73->component_needed != 0) {
        uVar46 = cinfo->output_iMCU_row;
        if (uVar46 < uVar45) {
          uVar55 = pjVar73->v_samp_factor;
          JVar74 = uVar55 * 3;
          uVar29 = uVar55;
        }
        else if (uVar46 < uVar43) {
          uVar55 = pjVar73->v_samp_factor;
          JVar74 = uVar55 * 2;
          uVar29 = uVar55;
        }
        else {
          uVar55 = pjVar73->v_samp_factor;
          JVar74 = pjVar73->height_in_blocks % uVar55;
          uVar29 = JVar74;
          if (JVar74 == 0) {
            JVar74 = uVar55;
            uVar29 = uVar55;
          }
        }
        if (uVar46 < 2) {
          p_Var7 = cinfo->mem->access_virt_barray;
          if (uVar46 == 1) {
            ppaJVar49 = (*p_Var7)((j_common_ptr)cinfo,
                                  (jvirt_barray_ptr)(&pjVar6[3].decompress_data)[lVar70],0,JVar74,0)
            ;
            ppaJVar49 = ppaJVar49 + pjVar73->v_samp_factor;
          }
          else {
            ppaJVar49 = (*p_Var7)((j_common_ptr)cinfo,
                                  (jvirt_barray_ptr)(&pjVar6[3].decompress_data)[lVar70],0,JVar74,0)
            ;
          }
        }
        else {
          ppaJVar49 = (*cinfo->mem->access_virt_barray)
                                ((j_common_ptr)cinfo,
                                 (jvirt_barray_ptr)(&pjVar6[3].decompress_data)[lVar70],
                                 (uVar46 - 2) * uVar55,JVar74 + uVar55 * 2,0);
          ppaJVar49 = ppaJVar49 + (long)pjVar73->v_samp_factor * 2;
        }
        pjVar51 = cinfo->master;
        p_Var8 = pjVar6[5].decompress_data;
        lVar30 = lVar70;
        if (pjVar51->last_good_iMCU_row < cinfo->output_iMCU_row) {
          lVar30 = (long)(int)lVar70 + (long)cinfo->num_components;
        }
        if (((((*(int *)(p_Var8 + lVar30 * 0x28 + 4) == -1) &&
              (*(int *)(p_Var8 + lVar30 * 0x28 + 8) == -1)) &&
             (*(int *)(p_Var8 + lVar30 * 0x28 + 0xc) == -1)) &&
            ((*(int *)(p_Var8 + lVar30 * 0x28 + 0x10) == -1 &&
             (*(int *)(p_Var8 + lVar30 * 0x28 + 0x14) == -1)))) &&
           ((*(int *)(p_Var8 + lVar30 * 0x28 + 0x18) == -1 &&
            ((*(int *)(p_Var8 + lVar30 * 0x28 + 0x1c) == -1 &&
             (*(int *)(p_Var8 + lVar30 * 0x28 + 0x20) == -1)))))) {
          bVar77 = *(int *)(p_Var8 + lVar30 * 0x28 + 0x24) == -1;
        }
        else {
          bVar77 = false;
        }
        pJVar9 = pjVar73->quant_table;
        uVar65 = (ulong)pJVar9->quantval[0];
        uVar1 = pJVar9->quantval[1];
        uVar2 = pJVar9->quantval[8];
        uVar3 = pJVar9->quantval[0x10];
        uVar4 = pJVar9->quantval[9];
        uVar5 = pJVar9->quantval[2];
        if (bVar77) {
          local_138 = (ulong)pJVar9->quantval[3];
          local_140 = (ulong)pJVar9->quantval[10];
          local_148 = (ulong)pJVar9->quantval[0x11];
          local_150 = (ulong)pJVar9->quantval[0x18];
        }
        if (0 < (int)uVar29) {
          p_Var10 = cinfo->idct->inverse_DCT[lVar70];
          uVar53 = (ulong)pJVar9->quantval[0] << 8;
          local_170 = output_buf[lVar70];
          uVar68 = 0;
          do {
            uVar57 = (ulong)pjVar51->first_MCU_col[lVar70];
            paJVar58 = ppaJVar49[uVar68] + uVar57;
            if (uVar68 == 0) {
              uVar46 = cinfo->output_iMCU_row;
              paJVar75 = paJVar58;
              local_1c0 = paJVar58;
              if (uVar46 != 0) {
                paJVar75 = ppaJVar49[-1] + uVar57;
                goto LAB_0012549a;
              }
            }
            else {
              paJVar75 = ppaJVar49[uVar68 - 1] + uVar57;
              if (uVar68 == 1) {
                uVar46 = cinfo->output_iMCU_row;
LAB_0012549a:
                local_1c0 = paJVar75;
                if (uVar46 < 2) goto LAB_001254b7;
              }
              local_1c0 = ppaJVar49[uVar68 - 2] + uVar57;
            }
LAB_001254b7:
            if ((uVar68 < uVar29 - 1) || (local_1b8 = paJVar58, cinfo->output_iMCU_row < uVar43)) {
              local_1b8 = ppaJVar49[uVar68 + 1] + uVar57;
            }
            if (((long)uVar68 < (long)(int)(uVar29 - 2)) ||
               (local_180 = local_1b8, cinfo->output_iMCU_row < uVar45)) {
              local_180 = ppaJVar49[uVar68 + 2] + uVar57;
            }
            if (pjVar51->last_MCU_col[lVar70] < pjVar51->first_MCU_col[lVar70]) {
              iVar52 = pjVar73->DCT_scaled_size;
            }
            else {
              uVar46 = pjVar73->width_in_blocks - 1;
              iVar44 = (int)(*local_180)[0];
              iVar54 = (int)(*local_1b8)[0];
              iVar62 = (int)(*paJVar58)[0];
              iVar60 = (int)(*paJVar75)[0];
              iVar47 = (int)(*local_1c0)[0];
              lVar59 = 0;
              JVar74 = 0;
              local_238 = iVar54;
              iVar72 = iVar44;
              iVar63 = iVar44;
              iVar31 = iVar44;
              iVar32 = iVar54;
              iVar33 = iVar54;
              iVar69 = iVar62;
              iVar41 = iVar62;
              iVar35 = iVar62;
              iVar61 = iVar60;
              iVar71 = iVar60;
              iVar37 = iVar60;
              iVar38 = iVar47;
              iVar39 = iVar47;
              iVar40 = iVar47;
              do {
                iVar36 = iVar71;
                iVar34 = iVar41;
                iVar41 = iVar69;
                iVar66 = iVar63;
                jcopy_block_row((JBLOCKROW)((long)*paJVar58 + lVar59),output_row,1);
                uVar55 = (uint)uVar57;
                iVar63 = iVar44;
                iVar67 = iVar54;
                iVar69 = iVar62;
                iVar71 = iVar60;
                iVar76 = iVar47;
                if ((uVar55 == cinfo->master->first_MCU_col[lVar70]) && (uVar55 < uVar46)) {
                  iVar76 = (int)*(short *)((long)local_1c0[1] + lVar59);
                  iVar71 = (int)*(short *)((long)paJVar75[1] + lVar59);
                  iVar69 = (int)*(short *)((long)paJVar58[1] + lVar59);
                  iVar67 = (int)*(short *)((long)local_1b8[1] + lVar59);
                  iVar63 = (int)*(short *)((long)local_180[1] + lVar59);
                }
                uVar55 = uVar55 + 1;
                uVar57 = (ulong)uVar55;
                if (uVar55 < uVar46) {
                  iVar47 = (int)*(short *)((long)local_1c0[2] + lVar59);
                  iVar60 = (int)*(short *)((long)paJVar75[2] + lVar59);
                  iVar62 = (int)*(short *)((long)paJVar58[2] + lVar59);
                  iVar54 = (int)*(short *)((long)local_1b8[2] + lVar59);
                  iVar44 = (int)*(short *)((long)local_180[2] + lVar59);
                }
                iVar52 = *(int *)(p_Var8 + lVar30 * 0x28 + 4);
                if ((iVar52 != 0) && ((*output_row)[1] == 0)) {
                  if (bVar77) {
                    iVar56 = ((iVar37 + iVar32) - (iVar67 + iVar71)) * 0xd + iVar47 +
                             (iVar76 - (iVar31 + iVar72 + iVar39 + iVar38)) + iVar63 +
                             (iVar34 - iVar69) * 0x26;
                    iVar48 = ((iVar60 - (iVar35 + iVar61 + local_238)) + iVar54 + iVar62) * 3 +
                             iVar44;
                  }
                  else {
                    iVar56 = (iVar34 - iVar69) * 0x32;
                    iVar48 = (iVar62 - iVar35) * 7;
                  }
                  lVar50 = (long)(iVar48 + iVar56) * uVar65;
                  if (lVar50 < 0) {
                    auVar16._8_8_ = 0;
                    auVar16._0_8_ = (ulong)uVar1 * 0x80 - lVar50;
                    iVar64 = 1 << ((byte)iVar52 & 0x1f);
                    iVar56 = SUB164(auVar16 / (ZEXT216(uVar1) << 8),0);
                    iVar48 = iVar64 + -1;
                    if (iVar56 < iVar64) {
                      iVar48 = iVar56;
                    }
                    if (iVar52 < 1) {
                      iVar48 = iVar56;
                    }
                    JVar42 = -(short)iVar48;
                  }
                  else {
                    auVar15._8_8_ = 0;
                    auVar15._0_8_ = lVar50 + (ulong)uVar1 * 0x80;
                    auVar15 = auVar15 / (ZEXT216(uVar1) << 8);
                    JVar42 = auVar15._0_2_;
                    if (0 < iVar52) {
                      iVar56 = 1 << ((byte)iVar52 & 0x1f);
                      iVar48 = auVar15._0_4_;
                      iVar52 = iVar56 + -1;
                      if (iVar48 < iVar56) {
                        iVar52 = iVar48;
                      }
                      JVar42 = (JCOEF)iVar52;
                    }
                  }
                  (*output_row)[1] = JVar42;
                }
                iVar52 = *(int *)(p_Var8 + lVar30 * 0x28 + 8);
                if ((iVar52 != 0) && ((*output_row)[8] == 0)) {
                  if (bVar77) {
                    iVar48 = ((local_238 - (iVar38 + iVar61)) + iVar72 + (iVar36 - iVar33) * 0x26 +
                              ((iVar37 + iVar71) - (iVar67 + iVar32)) * 0xd +
                             (((iVar66 + iVar31) - (iVar39 + iVar40 + iVar76)) + iVar63) * 3) -
                             (iVar47 + iVar60);
                    iVar56 = iVar44 + iVar54;
                  }
                  else {
                    iVar56 = (iVar36 - iVar33) * 0x32;
                    iVar48 = (iVar66 - iVar40) * 7;
                  }
                  lVar50 = (long)(iVar48 + iVar56) * uVar65;
                  if (lVar50 < 0) {
                    auVar18._8_8_ = 0;
                    auVar18._0_8_ = (ulong)uVar2 * 0x80 - lVar50;
                    iVar64 = 1 << ((byte)iVar52 & 0x1f);
                    iVar56 = SUB164(auVar18 / (ZEXT216(uVar2) << 8),0);
                    iVar48 = iVar64 + -1;
                    if (iVar56 < iVar64) {
                      iVar48 = iVar56;
                    }
                    if (iVar52 < 1) {
                      iVar48 = iVar56;
                    }
                    JVar42 = -(short)iVar48;
                  }
                  else {
                    auVar17._8_8_ = 0;
                    auVar17._0_8_ = lVar50 + (ulong)uVar2 * 0x80;
                    auVar17 = auVar17 / (ZEXT216(uVar2) << 8);
                    JVar42 = auVar17._0_2_;
                    if (0 < iVar52) {
                      iVar56 = 1 << ((byte)iVar52 & 0x1f);
                      iVar48 = auVar17._0_4_;
                      iVar52 = iVar56 + -1;
                      if (iVar48 < iVar56) {
                        iVar52 = iVar48;
                      }
                      JVar42 = (JCOEF)iVar52;
                    }
                  }
                  (*output_row)[8] = JVar42;
                }
                iVar52 = *(int *)(p_Var8 + lVar30 * 0x28 + 0xc);
                if ((iVar52 != 0) && ((*output_row)[0x10] == 0)) {
                  if (bVar77) {
                    iVar48 = (iVar33 + iVar36) * 7 + iVar66 + iVar41 * -0xe + iVar40 +
                             (iVar69 + iVar34) * -5 + (iVar67 + iVar71 + iVar37 + iVar32) * 2;
                  }
                  else {
                    iVar48 = ((iVar33 + iVar36) * 0xd + iVar41 * -0x18) - (iVar66 + iVar40);
                  }
                  lVar50 = (long)iVar48 * uVar65;
                  if (lVar50 < 0) {
                    auVar20._8_8_ = 0;
                    auVar20._0_8_ = (ulong)uVar3 * 0x80 - lVar50;
                    iVar64 = 1 << ((byte)iVar52 & 0x1f);
                    iVar56 = SUB164(auVar20 / (ZEXT216(uVar3) << 8),0);
                    iVar48 = iVar64 + -1;
                    if (iVar56 < iVar64) {
                      iVar48 = iVar56;
                    }
                    if (iVar52 < 1) {
                      iVar48 = iVar56;
                    }
                    JVar42 = -(short)iVar48;
                  }
                  else {
                    auVar19._8_8_ = 0;
                    auVar19._0_8_ = lVar50 + (ulong)uVar3 * 0x80;
                    auVar19 = auVar19 / (ZEXT216(uVar3) << 8);
                    JVar42 = auVar19._0_2_;
                    if (0 < iVar52) {
                      iVar56 = 1 << ((byte)iVar52 & 0x1f);
                      iVar48 = auVar19._0_4_;
                      iVar52 = iVar56 + -1;
                      if (iVar48 < iVar56) {
                        iVar52 = iVar48;
                      }
                      JVar42 = (JCOEF)iVar52;
                    }
                  }
                  (*output_row)[0x10] = JVar42;
                }
                iVar52 = *(int *)(p_Var8 + lVar30 * 0x28 + 0x10);
                if ((iVar52 != 0) && ((*output_row)[9] == 0)) {
                  iVar48 = (iVar37 - (iVar32 + iVar71)) + iVar67;
                  if (bVar77) {
                    iVar48 = ((iVar72 - iVar38) + iVar47 + iVar48 * 9) - iVar44;
                  }
                  else {
                    iVar48 = ((((local_238 - (iVar39 + iVar61)) + iVar76 + iVar31) - iVar63) +
                              iVar48 * 10 + iVar60) - iVar54;
                  }
                  lVar50 = (long)iVar48 * uVar65;
                  if (lVar50 < 0) {
                    auVar22._8_8_ = 0;
                    auVar22._0_8_ = (ulong)uVar4 * 0x80 - lVar50;
                    iVar64 = 1 << ((byte)iVar52 & 0x1f);
                    iVar56 = SUB164(auVar22 / (ZEXT216(uVar4) << 8),0);
                    iVar48 = iVar64 + -1;
                    if (iVar56 < iVar64) {
                      iVar48 = iVar56;
                    }
                    if (iVar52 < 1) {
                      iVar48 = iVar56;
                    }
                    JVar42 = -(short)iVar48;
                  }
                  else {
                    auVar21._8_8_ = 0;
                    auVar21._0_8_ = lVar50 + (ulong)uVar4 * 0x80;
                    auVar21 = auVar21 / (ZEXT216(uVar4) << 8);
                    JVar42 = auVar21._0_2_;
                    if (0 < iVar52) {
                      iVar56 = 1 << ((byte)iVar52 & 0x1f);
                      iVar48 = auVar21._0_4_;
                      iVar52 = iVar56 + -1;
                      if (iVar48 < iVar56) {
                        iVar52 = iVar48;
                      }
                      JVar42 = (JCOEF)iVar52;
                    }
                  }
                  (*output_row)[9] = JVar42;
                }
                iVar52 = *(int *)(p_Var8 + lVar30 * 0x28 + 0x14);
                if ((iVar52 != 0) && ((*output_row)[2] == 0)) {
                  if (bVar77) {
                    iVar48 = iVar41 * -0xe + iVar35 + (iVar33 + iVar36) * -5 + (iVar69 + iVar34) * 7
                             + (iVar67 + iVar71 + iVar37 + iVar32) * 2 + iVar62;
                  }
                  else {
                    iVar48 = ((iVar69 + iVar34) * 0xd + iVar41 * -0x18) - (iVar62 + iVar35);
                  }
                  lVar50 = (long)iVar48 * uVar65;
                  if (lVar50 < 0) {
                    auVar24._8_8_ = 0;
                    auVar24._0_8_ = (ulong)uVar5 * 0x80 - lVar50;
                    iVar64 = 1 << ((byte)iVar52 & 0x1f);
                    iVar56 = SUB164(auVar24 / (ZEXT216(uVar5) << 8),0);
                    iVar48 = iVar64 + -1;
                    if (iVar56 < iVar64) {
                      iVar48 = iVar56;
                    }
                    if (iVar52 < 1) {
                      iVar48 = iVar56;
                    }
                    JVar42 = -(short)iVar48;
                  }
                  else {
                    auVar23._8_8_ = 0;
                    auVar23._0_8_ = lVar50 + (ulong)uVar5 * 0x80;
                    auVar23 = auVar23 / (ZEXT216(uVar5) << 8);
                    JVar42 = auVar23._0_2_;
                    if (0 < iVar52) {
                      iVar56 = 1 << ((byte)iVar52 & 0x1f);
                      iVar48 = auVar23._0_4_;
                      iVar52 = iVar56 + -1;
                      if (iVar48 < iVar56) {
                        iVar52 = iVar48;
                      }
                      JVar42 = (JCOEF)iVar52;
                    }
                  }
                  (*output_row)[2] = JVar42;
                }
                if (bVar77) {
                  iVar52 = *(int *)(p_Var8 + lVar30 * 0x28 + 0x18);
                  if ((iVar52 != 0) && ((*output_row)[3] == 0)) {
                    lVar50 = (long)(((iVar37 + iVar32) - (iVar71 + iVar67)) + (iVar34 - iVar69) * 2)
                             * uVar65;
                    if (lVar50 < 0) {
                      iVar64 = 1 << ((byte)iVar52 & 0x1f);
                      iVar56 = (int)((local_138 * 0x80 - lVar50) / (local_138 << 8));
                      iVar48 = iVar64 + -1;
                      if (iVar56 < iVar64) {
                        iVar48 = iVar56;
                      }
                      if (iVar52 < 1) {
                        iVar48 = iVar56;
                      }
                      JVar42 = -(short)iVar48;
                    }
                    else {
                      auVar11._8_4_ = 0;
                      auVar11._0_8_ = local_138 << 8;
                      auVar25._8_4_ = 0;
                      auVar25._0_8_ = lVar50 + local_138 * 0x80;
                      JVar42 = SUB122(auVar25 / auVar11,0);
                      if (0 < iVar52) {
                        iVar56 = 1 << ((byte)iVar52 & 0x1f);
                        iVar48 = SUB124(auVar25 / auVar11,0);
                        iVar52 = iVar56 + -1;
                        if (iVar48 < iVar56) {
                          iVar52 = iVar48;
                        }
                        JVar42 = (JCOEF)iVar52;
                      }
                    }
                    (*output_row)[3] = JVar42;
                  }
                  iVar52 = *(int *)(p_Var8 + lVar30 * 0x28 + 0x1c);
                  if ((iVar52 != 0) && ((*output_row)[10] == 0)) {
                    lVar50 = (long)(((iVar37 - iVar32) + iVar71 + (iVar33 - iVar36) * 3) - iVar67) *
                             uVar65;
                    if (lVar50 < 0) {
                      iVar64 = 1 << ((byte)iVar52 & 0x1f);
                      iVar56 = (int)((local_140 * 0x80 - lVar50) / (local_140 << 8));
                      iVar48 = iVar64 + -1;
                      if (iVar56 < iVar64) {
                        iVar48 = iVar56;
                      }
                      if (iVar52 < 1) {
                        iVar48 = iVar56;
                      }
                      JVar42 = -(short)iVar48;
                    }
                    else {
                      auVar12._8_4_ = 0;
                      auVar12._0_8_ = local_140 << 8;
                      auVar26._8_4_ = 0;
                      auVar26._0_8_ = lVar50 + local_140 * 0x80;
                      JVar42 = SUB122(auVar26 / auVar12,0);
                      if (0 < iVar52) {
                        iVar56 = 1 << ((byte)iVar52 & 0x1f);
                        iVar48 = SUB124(auVar26 / auVar12,0);
                        iVar52 = iVar56 + -1;
                        if (iVar48 < iVar56) {
                          iVar52 = iVar48;
                        }
                        JVar42 = (JCOEF)iVar52;
                      }
                    }
                    (*output_row)[10] = JVar42;
                  }
                  iVar52 = *(int *)(p_Var8 + lVar30 * 0x28 + 0x20);
                  if ((iVar52 != 0) && ((*output_row)[0x11] == 0)) {
                    lVar50 = (long)(((iVar37 + iVar32) - (iVar71 + iVar67)) + (iVar69 - iVar34) * 3)
                             * uVar65;
                    if (lVar50 < 0) {
                      iVar64 = 1 << ((byte)iVar52 & 0x1f);
                      iVar56 = (int)((local_148 * 0x80 - lVar50) / (local_148 << 8));
                      iVar48 = iVar64 + -1;
                      if (iVar56 < iVar64) {
                        iVar48 = iVar56;
                      }
                      if (iVar52 < 1) {
                        iVar48 = iVar56;
                      }
                      JVar42 = -(short)iVar48;
                    }
                    else {
                      auVar13._8_4_ = 0;
                      auVar13._0_8_ = local_148 << 8;
                      auVar27._8_4_ = 0;
                      auVar27._0_8_ = lVar50 + local_148 * 0x80;
                      JVar42 = SUB122(auVar27 / auVar13,0);
                      if (0 < iVar52) {
                        iVar56 = 1 << ((byte)iVar52 & 0x1f);
                        iVar48 = SUB124(auVar27 / auVar13,0);
                        iVar52 = iVar56 + -1;
                        if (iVar48 < iVar56) {
                          iVar52 = iVar48;
                        }
                        JVar42 = (JCOEF)iVar52;
                      }
                    }
                    (*output_row)[0x11] = JVar42;
                  }
                  iVar52 = *(int *)(p_Var8 + lVar30 * 0x28 + 0x24);
                  if ((iVar52 != 0) && ((*output_row)[0x18] == 0)) {
                    lVar50 = (long)(((iVar37 - iVar32) + (iVar36 - iVar33) * 2 + iVar71) - iVar67) *
                             uVar65;
                    if (lVar50 < 0) {
                      iVar64 = 1 << ((byte)iVar52 & 0x1f);
                      iVar56 = (int)((local_150 * 0x80 - lVar50) / (local_150 << 8));
                      iVar48 = iVar64 + -1;
                      if (iVar56 < iVar64) {
                        iVar48 = iVar56;
                      }
                      if (iVar52 < 1) {
                        iVar48 = iVar56;
                      }
                      JVar42 = -(short)iVar48;
                    }
                    else {
                      auVar14._8_4_ = 0;
                      auVar14._0_8_ = local_150 << 8;
                      auVar28._8_4_ = 0;
                      auVar28._0_8_ = lVar50 + local_150 * 0x80;
                      JVar42 = SUB122(auVar28 / auVar14,0);
                      if (0 < iVar52) {
                        iVar56 = 1 << ((byte)iVar52 & 0x1f);
                        iVar48 = SUB124(auVar28 / auVar14,0);
                        iVar52 = iVar56 + -1;
                        if (iVar48 < iVar56) {
                          iVar52 = iVar48;
                        }
                        JVar42 = (JCOEF)iVar52;
                      }
                    }
                    (*output_row)[0x18] = JVar42;
                  }
                  lVar50 = (long)((((iVar33 + iVar69 + iVar36 + iVar34) * 0x2a + iVar41 * 0x98) -
                                  ((iVar72 + iVar38 + iVar47 + iVar44) * 2 +
                                  (iVar35 + iVar62 + iVar66 + iVar40) * 8)) +
                                 ((iVar71 + iVar67 + iVar32 + iVar37) -
                                 (iVar39 + iVar76 + iVar63 + iVar61 + local_238 + iVar31 +
                                 iVar54 + iVar60)) * 6);
                  if ((long)(lVar50 * uVar65) < 0) {
                    JVar42 = -(short)(((0x80 - lVar50) * uVar65) / uVar53);
                  }
                  else {
                    JVar42 = (JCOEF)(((lVar50 + 0x80) * uVar65) / uVar53);
                  }
                  (*output_row)[0] = JVar42;
                }
                (*p_Var10)(cinfo,pjVar73,(JCOEFPTR)output_row,local_170,JVar74);
                iVar52 = pjVar73->DCT_scaled_size;
                JVar74 = JVar74 + iVar52;
                pjVar51 = cinfo->master;
                lVar59 = lVar59 + 0x80;
                local_238 = iVar32;
                iVar72 = iVar31;
                iVar31 = iVar66;
                iVar32 = iVar33;
                iVar33 = iVar67;
                iVar35 = iVar34;
                iVar61 = iVar37;
                iVar37 = iVar36;
                iVar38 = iVar39;
                iVar39 = iVar40;
                iVar40 = iVar76;
              } while (uVar55 <= pjVar51->last_MCU_col[lVar70]);
            }
            local_170 = local_170 + iVar52;
            uVar68 = uVar68 + 1;
          } while (uVar68 != uVar29);
        }
      }
      lVar70 = lVar70 + 1;
      pjVar73 = pjVar73 + 1;
    } while (lVar70 < cinfo->num_components);
  }
  uVar43 = cinfo->output_iMCU_row + 1;
  cinfo->output_iMCU_row = uVar43;
  return 4 - (uint)(uVar43 < cinfo->total_iMCU_rows);
}

Assistant:

METHODDEF(int)
decompress_smooth_data(j_decompress_ptr cinfo, JSAMPIMAGE output_buf)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  JDIMENSION block_num, last_block_column;
  int ci, block_row, block_rows, access_rows;
  JBLOCKARRAY buffer;
  JBLOCKROW buffer_ptr, prev_prev_block_row, prev_block_row;
  JBLOCKROW next_block_row, next_next_block_row;
  JSAMPARRAY output_ptr;
  JDIMENSION output_col;
  jpeg_component_info *compptr;
  inverse_DCT_method_ptr inverse_DCT;
  boolean change_dc;
  JCOEF *workspace;
  int *coef_bits;
  JQUANT_TBL *quanttbl;
  JLONG Q00, Q01, Q02, Q03 = 0, Q10, Q11, Q12 = 0, Q20, Q21 = 0, Q30 = 0, num;
  int DC01, DC02, DC03, DC04, DC05, DC06, DC07, DC08, DC09, DC10, DC11, DC12,
      DC13, DC14, DC15, DC16, DC17, DC18, DC19, DC20, DC21, DC22, DC23, DC24,
      DC25;
  int Al, pred;

  /* Keep a local variable to avoid looking it up more than once */
  workspace = coef->workspace;

  /* Force some input to be done if we are getting ahead of the input. */
  while (cinfo->input_scan_number <= cinfo->output_scan_number &&
         !cinfo->inputctl->eoi_reached) {
    if (cinfo->input_scan_number == cinfo->output_scan_number) {
      /* If input is working on current scan, we ordinarily want it to
       * have completed the current row.  But if input scan is DC,
       * we want it to keep two rows ahead so that next two block rows' DC
       * values are up to date.
       */
      JDIMENSION delta = (cinfo->Ss == 0) ? 2 : 0;
      if (cinfo->input_iMCU_row > cinfo->output_iMCU_row + delta)
        break;
    }
    if ((*cinfo->inputctl->consume_input) (cinfo) == JPEG_SUSPENDED)
      return JPEG_SUSPENDED;
  }

  /* OK, output from the virtual arrays. */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Don't bother to IDCT an uninteresting component. */
    if (!compptr->component_needed)
      continue;
    /* Count non-dummy DCT block rows in this iMCU row. */
    if (cinfo->output_iMCU_row < last_iMCU_row - 1) {
      block_rows = compptr->v_samp_factor;
      access_rows = block_rows * 3; /* this and next two iMCU rows */
    } else if (cinfo->output_iMCU_row < last_iMCU_row) {
      block_rows = compptr->v_samp_factor;
      access_rows = block_rows * 2; /* this and next iMCU row */
    } else {
      /* NB: can't use last_row_height here; it is input-side-dependent! */
      block_rows = (int)(compptr->height_in_blocks % compptr->v_samp_factor);
      if (block_rows == 0) block_rows = compptr->v_samp_factor;
      access_rows = block_rows; /* this iMCU row only */
    }
    /* Align the virtual buffer for this component. */
    if (cinfo->output_iMCU_row > 1) {
      access_rows += 2 * compptr->v_samp_factor; /* prior two iMCU rows too */
      buffer = (*cinfo->mem->access_virt_barray)
        ((j_common_ptr)cinfo, coef->whole_image[ci],
         (cinfo->output_iMCU_row - 2) * compptr->v_samp_factor,
         (JDIMENSION)access_rows, FALSE);
      buffer += 2 * compptr->v_samp_factor; /* point to current iMCU row */
    } else if (cinfo->output_iMCU_row > 0) {
      buffer = (*cinfo->mem->access_virt_barray)
        ((j_common_ptr)cinfo, coef->whole_image[ci],
         (cinfo->output_iMCU_row - 1) * compptr->v_samp_factor,
         (JDIMENSION)access_rows, FALSE);
      buffer += compptr->v_samp_factor; /* point to current iMCU row */
    } else {
      buffer = (*cinfo->mem->access_virt_barray)
        ((j_common_ptr)cinfo, coef->whole_image[ci],
         (JDIMENSION)0, (JDIMENSION)access_rows, FALSE);
    }
    /* Fetch component-dependent info.
     * If the current scan is incomplete, then we use the component-dependent
     * info from the previous scan.
     */
    if (cinfo->output_iMCU_row > cinfo->master->last_good_iMCU_row)
      coef_bits =
        coef->coef_bits_latch + ((ci + cinfo->num_components) * SAVED_COEFS);
    else
      coef_bits = coef->coef_bits_latch + (ci * SAVED_COEFS);

    /* We only do DC interpolation if no AC coefficient data is available. */
    change_dc =
      coef_bits[1] == -1 && coef_bits[2] == -1 && coef_bits[3] == -1 &&
      coef_bits[4] == -1 && coef_bits[5] == -1 && coef_bits[6] == -1 &&
      coef_bits[7] == -1 && coef_bits[8] == -1 && coef_bits[9] == -1;

    quanttbl = compptr->quant_table;
    Q00 = quanttbl->quantval[0];
    Q01 = quanttbl->quantval[Q01_POS];
    Q10 = quanttbl->quantval[Q10_POS];
    Q20 = quanttbl->quantval[Q20_POS];
    Q11 = quanttbl->quantval[Q11_POS];
    Q02 = quanttbl->quantval[Q02_POS];
    if (change_dc) {
      Q03 = quanttbl->quantval[Q03_POS];
      Q12 = quanttbl->quantval[Q12_POS];
      Q21 = quanttbl->quantval[Q21_POS];
      Q30 = quanttbl->quantval[Q30_POS];
    }
    inverse_DCT = cinfo->idct->inverse_DCT[ci];
    output_ptr = output_buf[ci];
    /* Loop over all DCT blocks to be processed. */
    for (block_row = 0; block_row < block_rows; block_row++) {
      buffer_ptr = buffer[block_row] + cinfo->master->first_MCU_col[ci];

      if (block_row > 0 || cinfo->output_iMCU_row > 0)
        prev_block_row =
          buffer[block_row - 1] + cinfo->master->first_MCU_col[ci];
      else
        prev_block_row = buffer_ptr;

      if (block_row > 1 || cinfo->output_iMCU_row > 1)
        prev_prev_block_row =
          buffer[block_row - 2] + cinfo->master->first_MCU_col[ci];
      else
        prev_prev_block_row = prev_block_row;

      if (block_row < block_rows - 1 || cinfo->output_iMCU_row < last_iMCU_row)
        next_block_row =
          buffer[block_row + 1] + cinfo->master->first_MCU_col[ci];
      else
        next_block_row = buffer_ptr;

      if (block_row < block_rows - 2 ||
          cinfo->output_iMCU_row < last_iMCU_row - 1)
        next_next_block_row =
          buffer[block_row + 2] + cinfo->master->first_MCU_col[ci];
      else
        next_next_block_row = next_block_row;

      /* We fetch the surrounding DC values using a sliding-register approach.
       * Initialize all 25 here so as to do the right thing on narrow pics.
       */
      DC01 = DC02 = DC03 = DC04 = DC05 = (int)prev_prev_block_row[0][0];
      DC06 = DC07 = DC08 = DC09 = DC10 = (int)prev_block_row[0][0];
      DC11 = DC12 = DC13 = DC14 = DC15 = (int)buffer_ptr[0][0];
      DC16 = DC17 = DC18 = DC19 = DC20 = (int)next_block_row[0][0];
      DC21 = DC22 = DC23 = DC24 = DC25 = (int)next_next_block_row[0][0];
      output_col = 0;
      last_block_column = compptr->width_in_blocks - 1;
      for (block_num = cinfo->master->first_MCU_col[ci];
           block_num <= cinfo->master->last_MCU_col[ci]; block_num++) {
        /* Fetch current DCT block into workspace so we can modify it. */
        jcopy_block_row(buffer_ptr, (JBLOCKROW)workspace, (JDIMENSION)1);
        /* Update DC values */
        if (block_num == cinfo->master->first_MCU_col[ci] &&
            block_num < last_block_column) {
          DC04 = (int)prev_prev_block_row[1][0];
          DC09 = (int)prev_block_row[1][0];
          DC14 = (int)buffer_ptr[1][0];
          DC19 = (int)next_block_row[1][0];
          DC24 = (int)next_next_block_row[1][0];
        }
        if (block_num + 1 < last_block_column) {
          DC05 = (int)prev_prev_block_row[2][0];
          DC10 = (int)prev_block_row[2][0];
          DC15 = (int)buffer_ptr[2][0];
          DC20 = (int)next_block_row[2][0];
          DC25 = (int)next_next_block_row[2][0];
        }
        /* If DC interpolation is enabled, compute coefficient estimates using
         * a Gaussian-like kernel, keeping the averages of the DC values.
         *
         * If DC interpolation is disabled, compute coefficient estimates using
         * an algorithm similar to the one described in Section K.8 of the JPEG
         * standard, except applied to a 5x5 window rather than a 3x3 window.
         *
         * An estimate is applied only if the coefficient is still zero and is
         * not known to be fully accurate.
         */
        /* AC01 */
        if ((Al = coef_bits[1]) != 0 && workspace[1] == 0) {
          num = Q00 * (change_dc ?
                (-DC01 - DC02 + DC04 + DC05 - 3 * DC06 + 13 * DC07 -
                 13 * DC09 + 3 * DC10 - 3 * DC11 + 38 * DC12 - 38 * DC14 +
                 3 * DC15 - 3 * DC16 + 13 * DC17 - 13 * DC19 + 3 * DC20 -
                 DC21 - DC22 + DC24 + DC25) :
                (-7 * DC11 + 50 * DC12 - 50 * DC14 + 7 * DC15));
          if (num >= 0) {
            pred = (int)(((Q01 << 7) + num) / (Q01 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
          } else {
            pred = (int)(((Q01 << 7) - num) / (Q01 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
            pred = -pred;
          }
          workspace[1] = (JCOEF)pred;
        }
        /* AC10 */
        if ((Al = coef_bits[2]) != 0 && workspace[8] == 0) {
          num = Q00 * (change_dc ?
                (-DC01 - 3 * DC02 - 3 * DC03 - 3 * DC04 - DC05 - DC06 +
                 13 * DC07 + 38 * DC08 + 13 * DC09 - DC10 + DC16 -
                 13 * DC17 - 38 * DC18 - 13 * DC19 + DC20 + DC21 +
                 3 * DC22 + 3 * DC23 + 3 * DC24 + DC25) :
                (-7 * DC03 + 50 * DC08 - 50 * DC18 + 7 * DC23));
          if (num >= 0) {
            pred = (int)(((Q10 << 7) + num) / (Q10 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
          } else {
            pred = (int)(((Q10 << 7) - num) / (Q10 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
            pred = -pred;
          }
          workspace[8] = (JCOEF)pred;
        }
        /* AC20 */
        if ((Al = coef_bits[3]) != 0 && workspace[16] == 0) {
          num = Q00 * (change_dc ?
                (DC03 + 2 * DC07 + 7 * DC08 + 2 * DC09 - 5 * DC12 - 14 * DC13 -
                 5 * DC14 + 2 * DC17 + 7 * DC18 + 2 * DC19 + DC23) :
                (-DC03 + 13 * DC08 - 24 * DC13 + 13 * DC18 - DC23));
          if (num >= 0) {
            pred = (int)(((Q20 << 7) + num) / (Q20 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
          } else {
            pred = (int)(((Q20 << 7) - num) / (Q20 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
            pred = -pred;
          }
          workspace[16] = (JCOEF)pred;
        }
        /* AC11 */
        if ((Al = coef_bits[4]) != 0 && workspace[9] == 0) {
          num = Q00 * (change_dc ?
                (-DC01 + DC05 + 9 * DC07 - 9 * DC09 - 9 * DC17 +
                 9 * DC19 + DC21 - DC25) :
                (DC10 + DC16 - 10 * DC17 + 10 * DC19 - DC02 - DC20 + DC22 -
                 DC24 + DC04 - DC06 + 10 * DC07 - 10 * DC09));
          if (num >= 0) {
            pred = (int)(((Q11 << 7) + num) / (Q11 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
          } else {
            pred = (int)(((Q11 << 7) - num) / (Q11 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
            pred = -pred;
          }
          workspace[9] = (JCOEF)pred;
        }
        /* AC02 */
        if ((Al = coef_bits[5]) != 0 && workspace[2] == 0) {
          num = Q00 * (change_dc ?
                (2 * DC07 - 5 * DC08 + 2 * DC09 + DC11 + 7 * DC12 - 14 * DC13 +
                 7 * DC14 + DC15 + 2 * DC17 - 5 * DC18 + 2 * DC19) :
                (-DC11 + 13 * DC12 - 24 * DC13 + 13 * DC14 - DC15));
          if (num >= 0) {
            pred = (int)(((Q02 << 7) + num) / (Q02 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
          } else {
            pred = (int)(((Q02 << 7) - num) / (Q02 << 8));
            if (Al > 0 && pred >= (1 << Al))
              pred = (1 << Al) - 1;
            pred = -pred;
          }
          workspace[2] = (JCOEF)pred;
        }
        if (change_dc) {
          /* AC03 */
          if ((Al = coef_bits[6]) != 0 && workspace[3] == 0) {
            num = Q00 * (DC07 - DC09 + 2 * DC12 - 2 * DC14 + DC17 - DC19);
            if (num >= 0) {
              pred = (int)(((Q03 << 7) + num) / (Q03 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
            } else {
              pred = (int)(((Q03 << 7) - num) / (Q03 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
              pred = -pred;
            }
            workspace[3] = (JCOEF)pred;
          }
          /* AC12 */
          if ((Al = coef_bits[7]) != 0 && workspace[10] == 0) {
            num = Q00 * (DC07 - 3 * DC08 + DC09 - DC17 + 3 * DC18 - DC19);
            if (num >= 0) {
              pred = (int)(((Q12 << 7) + num) / (Q12 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
            } else {
              pred = (int)(((Q12 << 7) - num) / (Q12 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
              pred = -pred;
            }
            workspace[10] = (JCOEF)pred;
          }
          /* AC21 */
          if ((Al = coef_bits[8]) != 0 && workspace[17] == 0) {
            num = Q00 * (DC07 - DC09 - 3 * DC12 + 3 * DC14 + DC17 - DC19);
            if (num >= 0) {
              pred = (int)(((Q21 << 7) + num) / (Q21 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
            } else {
              pred = (int)(((Q21 << 7) - num) / (Q21 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
              pred = -pred;
            }
            workspace[17] = (JCOEF)pred;
          }
          /* AC30 */
          if ((Al = coef_bits[9]) != 0 && workspace[24] == 0) {
            num = Q00 * (DC07 + 2 * DC08 + DC09 - DC17 - 2 * DC18 - DC19);
            if (num >= 0) {
              pred = (int)(((Q30 << 7) + num) / (Q30 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
            } else {
              pred = (int)(((Q30 << 7) - num) / (Q30 << 8));
              if (Al > 0 && pred >= (1 << Al))
                pred = (1 << Al) - 1;
              pred = -pred;
            }
            workspace[24] = (JCOEF)pred;
          }
          /* coef_bits[0] is non-negative.  Otherwise this function would not
           * be called.
           */
          num = Q00 *
                (-2 * DC01 - 6 * DC02 - 8 * DC03 - 6 * DC04 - 2 * DC05 -
                 6 * DC06 + 6 * DC07 + 42 * DC08 + 6 * DC09 - 6 * DC10 -
                 8 * DC11 + 42 * DC12 + 152 * DC13 + 42 * DC14 - 8 * DC15 -
                 6 * DC16 + 6 * DC17 + 42 * DC18 + 6 * DC19 - 6 * DC20 -
                 2 * DC21 - 6 * DC22 - 8 * DC23 - 6 * DC24 - 2 * DC25);
          if (num >= 0) {
            pred = (int)(((Q00 << 7) + num) / (Q00 << 8));
          } else {
            pred = (int)(((Q00 << 7) - num) / (Q00 << 8));
            pred = -pred;
          }
          workspace[0] = (JCOEF)pred;
        }  /* change_dc */

        /* OK, do the IDCT */
        (*inverse_DCT) (cinfo, compptr, (JCOEFPTR)workspace, output_ptr,
                        output_col);
        /* Advance for next column */
        DC01 = DC02;  DC02 = DC03;  DC03 = DC04;  DC04 = DC05;
        DC06 = DC07;  DC07 = DC08;  DC08 = DC09;  DC09 = DC10;
        DC11 = DC12;  DC12 = DC13;  DC13 = DC14;  DC14 = DC15;
        DC16 = DC17;  DC17 = DC18;  DC18 = DC19;  DC19 = DC20;
        DC21 = DC22;  DC22 = DC23;  DC23 = DC24;  DC24 = DC25;
        buffer_ptr++, prev_block_row++, next_block_row++,
          prev_prev_block_row++, next_next_block_row++;
        output_col += compptr->_DCT_scaled_size;
      }
      output_ptr += compptr->_DCT_scaled_size;
    }
  }

  if (++(cinfo->output_iMCU_row) < cinfo->total_iMCU_rows)
    return JPEG_ROW_COMPLETED;
  return JPEG_SCAN_COMPLETED;
}